

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct_x86_avx::create_pipeline(InnerProduct_x86_avx *this,Option *opt)

{
  uint _h;
  int iVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  _func_int **pp_Var5;
  size_t sVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  Layer *pLVar11;
  undefined4 *puVar12;
  _func_int *p_Var13;
  ulong uVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  ulong uVar17;
  undefined4 *puVar18;
  ulong uVar19;
  int _elempack;
  ulong uVar20;
  ParamDict pd;
  Mat local_78;
  
  pLVar11 = create_layer(0xe);
  this->flatten = pLVar11;
  ParamDict::ParamDict((ParamDict *)&local_78);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_78);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_78);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_avx[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar10 = cpu_support_x86_f16c();
  if ((iVar10 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  p_Var13 = this->_vptr_InnerProduct_x86_avx[-3];
  _h = *(uint *)(&this->field_0xd0 + (long)p_Var13);
  iVar10 = *(int *)(&this->field_0xd8 + (long)p_Var13);
  uVar7 = (long)iVar10 / (long)(int)_h;
  if (opt->use_packing_layout == true) {
    if ((_h & 7) == 0) {
      uVar20 = 8;
    }
    else {
      if ((_h & 3) != 0) goto LAB_0030da0f;
      uVar20 = 4;
    }
    iVar10 = (int)uVar7;
    Mat::reshape(&local_78,(Mat *)(&this->field_0x130 + (long)p_Var13),iVar10,_h,(Allocator *)0x0);
    _elempack = (int)uVar20;
    Mat::create(&this->weight_data_tm,iVar10,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]) / _elempack
                ,(ulong)(uint)(_elempack * 4),_elempack,(Allocator *)0x0);
    pp_Var5 = this->_vptr_InnerProduct_x86_avx;
    p_Var13 = pp_Var5[-3];
    if (_elempack <= *(int *)(&this->field_0xd0 + (long)p_Var13)) {
      pvVar3 = (this->weight_data_tm).data;
      iVar1 = (this->weight_data_tm).w;
      sVar6 = (this->weight_data_tm).elemsize;
      uVar14 = 0;
      puVar16 = (undefined4 *)local_78.data;
      do {
        if (0 < iVar10) {
          puVar12 = (undefined4 *)
                    (((uVar14 & 0xffffffff) / uVar20) * (long)iVar1 * sVar6 + (long)pvVar3);
          uVar17 = 0;
          puVar15 = puVar16;
          uVar19 = uVar20;
          puVar18 = puVar16;
          do {
            do {
              *puVar12 = *puVar15;
              puVar12 = puVar12 + 1;
              uVar19 = uVar19 - 1;
              puVar15 = (undefined4 *)((long)puVar15 + (long)local_78.w * local_78.elemsize);
            } while (uVar19 != 0);
            uVar17 = uVar17 + 1;
            puVar15 = puVar18 + 1;
            uVar19 = uVar20;
            puVar18 = puVar15;
          } while (uVar17 != (uVar7 & 0xffffffff));
          p_Var13 = pp_Var5[-3];
        }
        uVar14 = uVar14 + uVar20;
        puVar16 = (undefined4 *)((long)puVar16 + (long)local_78.w * local_78.elemsize * uVar20);
      } while ((long)(uVar14 + (_elempack - 1)) < (long)*(int *)(&this->field_0xd0 + (long)p_Var13))
      ;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
LAB_0030da0f:
    if (p_Var13 != (_func_int *)0xfffffffffffffee0) {
      piVar2 = *(int **)(&this->field_0x138 + (long)p_Var13);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (this->weight_data_tm).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->weight_data_tm).data;
          pAVar4 = (this->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar3,(long)iVar10 % (long)(int)_h & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      piVar2 = *(int **)((long)(&this->field_0x130 + (long)p_Var13) + 8);
      (this->weight_data_tm).data = *(void **)(&this->field_0x130 + (long)p_Var13);
      (this->weight_data_tm).refcount = piVar2;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var13);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var13);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var13);
      uVar8 = *(undefined8 *)(&this->field_0x158 + (long)p_Var13);
      uVar9 = *(undefined8 *)((long)(&this->field_0x158 + (long)p_Var13) + 8);
      (this->weight_data_tm).dims = (int)uVar8;
      (this->weight_data_tm).w = (int)((ulong)uVar8 >> 0x20);
      (this->weight_data_tm).h = (int)uVar9;
      (this->weight_data_tm).d = (int)((ulong)uVar9 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var13);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var13);
    }
  }
  if (opt->lightmode == true) {
    p_Var13 = this->_vptr_InnerProduct_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x138 + (long)p_Var13);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var13) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var13) != (void *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var13));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var13) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var13) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var13) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var13) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_tm.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_tm.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }
    else
    {
        weight_data_tm = weight_data;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}